

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_s2c_verify_commit
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *data32,
              secp256k1_ecdsa_s2c_opening *opening)

{
  int iVar1;
  undefined1 local_1d0 [8];
  secp256k1_sha256 s2c_sha;
  secp256k1_scalar x_scalar;
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  uchar x_bytes [32];
  undefined1 local_e0 [8];
  secp256k1_ge original_pubnonce_ge;
  secp256k1_ge commitment_ge;
  secp256k1_ecdsa_s2c_opening *opening_local;
  uchar *data32_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (data32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"data32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (opening == (secp256k1_ecdsa_s2c_opening *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"opening != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_s2c_opening_load(ctx,(secp256k1_ge *)local_e0,opening);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_s2c_ecdsa_point_sha256_tagged((secp256k1_sha256 *)local_1d0);
      iVar1 = secp256k1_ec_commit((secp256k1_ge *)&original_pubnonce_ge.infinity,
                                  (secp256k1_ge *)local_e0,(secp256k1_sha256 *)local_1d0,data32,0x20
                                 );
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        secp256k1_ecdsa_signature_load
                  (ctx,(secp256k1_scalar *)(sigs.d + 3),(secp256k1_scalar *)(x_scalar.d + 3),sig);
        secp256k1_fe_normalize((secp256k1_fe *)&original_pubnonce_ge.infinity);
        secp256k1_fe_get_b32((uchar *)(sigr.d + 3),(secp256k1_fe *)&original_pubnonce_ge.infinity);
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)&s2c_sha.bytes,(uchar *)(sigr.d + 3),(int *)0x0);
        ctx_local._4_4_ =
             secp256k1_scalar_eq((secp256k1_scalar *)(sigs.d + 3),(secp256k1_scalar *)&s2c_sha.bytes
                                );
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_s2c_verify_commit(const secp256k1_context* ctx, const secp256k1_ecdsa_signature* sig, const unsigned char* data32, const secp256k1_ecdsa_s2c_opening* opening) {
    secp256k1_ge commitment_ge;
    secp256k1_ge original_pubnonce_ge;
    unsigned char x_bytes[32];
    secp256k1_scalar sigr, sigs, x_scalar;
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(data32 != NULL);
    ARG_CHECK(opening != NULL);

    if (!secp256k1_ecdsa_s2c_opening_load(ctx, &original_pubnonce_ge, opening)) {
        return 0;
    }
    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    if (!secp256k1_ec_commit(&commitment_ge, &original_pubnonce_ge, &s2c_sha, data32, 32)) {
        return 0;
    }

    /* Check that sig_r == commitment_x (mod n)
     * sig_r is the x coordinate of R represented by a scalar.
     * commitment_x is the x coordinate of the commitment (field element).
     *
     * Note that we are only checking the x-coordinate -- this is because the y-coordinate
     * is not part of the ECDSA signature (and therefore not part of the commitment!)
     */
    secp256k1_ecdsa_signature_load(ctx, &sigr, &sigs, sig);

    secp256k1_fe_normalize(&commitment_ge.x);
    secp256k1_fe_get_b32(x_bytes, &commitment_ge.x);
    /* Do not check overflow; overflowing a scalar does not affect whether
     * or not the R value is a cryptographic commitment, only whether it
     * is a valid R value for an ECDSA signature. If users care about that
     * they should use `ecdsa_verify` or `anti_exfil_host_verify`. In other
     * words, this check would be (at best) unnecessary, and (at worst)
     * insufficient. */
    secp256k1_scalar_set_b32(&x_scalar, x_bytes, NULL);
    return secp256k1_scalar_eq(&sigr, &x_scalar);
}